

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  NodeRef *pNVar2;
  NodeRef *pNVar3;
  float *pfVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar7;
  bool bVar8;
  uint uVar9;
  size_t sVar10;
  size_t sVar11;
  _func_int **pp_Var12;
  size_t sVar13;
  size_t sVar14;
  int iVar15;
  ulong uVar16;
  undefined4 uVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  NodeRef nodeRef;
  NodeRef *pNVar22;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar23;
  long lVar24;
  bool bVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  vint4 ai_2;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 ai;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 ai_3;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 bi;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 bi_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vint4 bi_3;
  undefined1 auVar79 [16];
  vint4 bi_2;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar85;
  float fVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar87;
  float fVar88;
  float fVar90;
  float fVar91;
  undefined1 auVar89 [16];
  float fVar92;
  float fVar93;
  float fVar95;
  float fVar96;
  undefined1 auVar94 [16];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  float fVar100;
  float fVar103;
  undefined1 auVar102 [64];
  float fVar104;
  float fVar108;
  undefined1 auVar106 [64];
  float fVar109;
  float fVar113;
  undefined1 auVar111 [64];
  vint<4> octant;
  vint4 bi_8;
  undefined1 local_17d8 [16];
  RayHitK<4> *local_17c0;
  long local_17b8;
  RTCIntersectFunctionNArguments local_17b0;
  Geometry *local_1780;
  undefined8 local_1778;
  RTCIntersectArguments *local_1770;
  undefined1 local_1768 [16];
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [64];
  undefined1 auVar110 [16];
  undefined1 auVar112 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar28 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar29 = vpcmpeqd_avx(auVar28,(undefined1  [16])valid_i->field_0);
      uVar9 = vmovmskps_avx(auVar29);
      if (uVar9 == 0) {
        return;
      }
      stack_node[0xb4].ptr = (size_t)This->ptr;
      stack_node[0xb5].ptr = (size_t)(uVar9 & 0xff);
      auVar63 = *(undefined1 (*) [16])ray;
      auVar102 = ZEXT1664(auVar63);
      auVar42 = *(undefined1 (*) [16])(ray + 0x10);
      auVar106 = ZEXT1664(auVar42);
      auVar54 = *(undefined1 (*) [16])(ray + 0x20);
      auVar111 = ZEXT1664(auVar54);
      auVar47 = *(undefined1 (*) [16])(ray + 0x40);
      auVar60._8_4_ = 0x7fffffff;
      auVar60._0_8_ = 0x7fffffff7fffffff;
      auVar60._12_4_ = 0x7fffffff;
      auVar53 = vandps_avx(auVar47,auVar60);
      auVar75._8_4_ = 0x219392ef;
      auVar75._0_8_ = 0x219392ef219392ef;
      auVar75._12_4_ = 0x219392ef;
      auVar53 = vcmpps_avx(auVar53,auVar75,1);
      auVar62 = vblendvps_avx(auVar47,auVar75,auVar53);
      auVar53 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar60);
      auVar53 = vcmpps_avx(auVar53,auVar75,1);
      auVar61 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar75,auVar53);
      auVar53 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar60);
      auVar53 = vcmpps_avx(auVar53,auVar75,1);
      auVar53 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar75,auVar53);
      auVar60 = vrcpps_avx(auVar62);
      fVar82 = auVar60._0_4_;
      auVar70._0_4_ = auVar62._0_4_ * fVar82;
      fVar88 = auVar60._4_4_;
      auVar70._4_4_ = auVar62._4_4_ * fVar88;
      fVar93 = auVar60._8_4_;
      auVar70._8_4_ = auVar62._8_4_ * fVar93;
      fVar85 = auVar60._12_4_;
      auVar70._12_4_ = auVar62._12_4_ * fVar85;
      auVar81._8_4_ = 0x3f800000;
      auVar81._0_8_ = &DAT_3f8000003f800000;
      auVar81._12_4_ = 0x3f800000;
      auVar62 = vsubps_avx(auVar81,auVar70);
      fVar100 = fVar82 + fVar82 * auVar62._0_4_;
      fVar103 = fVar88 + fVar88 * auVar62._4_4_;
      auVar101._0_8_ = CONCAT44(fVar103,fVar100);
      auVar101._8_4_ = fVar93 + fVar93 * auVar62._8_4_;
      auVar101._12_4_ = fVar85 + fVar85 * auVar62._12_4_;
      auVar31 = ZEXT1664(auVar101);
      auVar62 = vrcpps_avx(auVar61);
      fVar82 = auVar62._0_4_;
      auVar76._0_4_ = auVar61._0_4_ * fVar82;
      fVar88 = auVar62._4_4_;
      auVar76._4_4_ = auVar61._4_4_ * fVar88;
      fVar93 = auVar62._8_4_;
      auVar76._8_4_ = auVar61._8_4_ * fVar93;
      fVar85 = auVar62._12_4_;
      auVar76._12_4_ = auVar61._12_4_ * fVar85;
      auVar62 = vsubps_avx(auVar81,auVar76);
      fVar104 = fVar82 + fVar82 * auVar62._0_4_;
      fVar108 = fVar88 + fVar88 * auVar62._4_4_;
      auVar105._0_8_ = CONCAT44(fVar108,fVar104);
      auVar105._8_4_ = fVar93 + fVar93 * auVar62._8_4_;
      auVar105._12_4_ = fVar85 + fVar85 * auVar62._12_4_;
      auVar107 = ZEXT1664(auVar105);
      auVar62 = vrcpps_avx(auVar53);
      fVar82 = auVar62._0_4_;
      auVar61._0_4_ = auVar53._0_4_ * fVar82;
      fVar88 = auVar62._4_4_;
      auVar61._4_4_ = auVar53._4_4_ * fVar88;
      fVar93 = auVar62._8_4_;
      auVar61._8_4_ = auVar53._8_4_ * fVar93;
      fVar85 = auVar62._12_4_;
      auVar61._12_4_ = auVar53._12_4_ * fVar85;
      auVar53 = vsubps_avx(auVar81,auVar61);
      fVar109 = fVar82 + fVar82 * auVar53._0_4_;
      fVar113 = fVar88 + fVar88 * auVar53._4_4_;
      auVar110._0_8_ = CONCAT44(fVar113,fVar109);
      auVar110._8_4_ = fVar93 + fVar93 * auVar53._8_4_;
      auVar110._12_4_ = fVar85 + fVar85 * auVar53._12_4_;
      auVar112 = ZEXT1664(auVar110);
      auVar62 = ZEXT816(0) << 0x20;
      auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar62);
      stack_node[0xc0].ptr = auVar53._0_8_;
      stack_node[0xc1].ptr = auVar53._8_8_;
      auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar62);
      stack_node[0xbe].ptr = auVar53._0_8_;
      stack_node[0xbf].ptr = auVar53._8_8_;
      auVar47 = vcmpps_avx(auVar47,auVar62,1);
      auVar53._8_4_ = 1;
      auVar53._0_8_ = 0x100000001;
      auVar53._12_4_ = 1;
      auVar47 = vandps_avx(auVar47,auVar53);
      auVar53 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar62,1);
      auVar71._8_4_ = 2;
      auVar71._0_8_ = 0x200000002;
      auVar71._12_4_ = 2;
      auVar53 = vandps_avx(auVar53,auVar71);
      auVar53 = vorps_avx(auVar53,auVar47);
      auVar47 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar62,1);
      auVar62._8_4_ = 4;
      auVar62._0_8_ = 0x400000004;
      auVar62._12_4_ = 4;
      auVar47 = vandps_avx(auVar47,auVar62);
      auVar28 = vpor_avx(auVar29 ^ auVar28,auVar47);
      auVar28 = vpor_avx(auVar28,auVar53);
      stack_node[0xbc].ptr = auVar28._0_8_;
      stack_node[0xbd].ptr = auVar28._8_8_;
      auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      stack_node[0xa3].ptr = 8;
      stack_node[0xb7].ptr = (size_t)context;
      stack_node[0xb6].ptr = (size_t)ray;
      stack_node[0xcc].ptr = auVar63._0_8_;
      stack_node[0xcd].ptr = auVar63._8_8_;
      stack_node[0xca].ptr = auVar42._0_8_;
      stack_node[0xcb].ptr = auVar42._8_8_;
      stack_node[200].ptr = auVar54._0_8_;
      stack_node[0xc9].ptr = auVar54._8_8_;
      stack_node[0xc6].ptr = auVar101._0_8_;
      stack_node[199].ptr = auVar101._8_8_;
      stack_node[0xc4].ptr = auVar105._0_8_;
      stack_node[0xc5].ptr = auVar105._8_8_;
      stack_node[0xc2].ptr = auVar110._0_8_;
      stack_node[0xc3].ptr = auVar110._8_8_;
LAB_0037bac3:
      lVar24 = 0;
      if (stack_node[0xb5].ptr != 0) {
        for (; (stack_node[0xb5].ptr >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      uVar17 = *(undefined4 *)((long)&stack_node[0xbc].ptr + lVar24 * 4);
      auVar28._4_4_ = uVar17;
      auVar28._0_4_ = uVar17;
      auVar28._8_4_ = uVar17;
      auVar28._12_4_ = uVar17;
      auVar61 = vpcmpeqd_avx(auVar28,stack_node._1504_16_);
      uVar17 = vmovmskps_avx(auVar61);
      stack_node[0xb5].ptr = ~CONCAT44((int)((ulong)lVar24 >> 0x20),uVar17) & stack_node[0xb5].ptr;
      auVar70 = auVar99._0_16_;
      auVar28 = vblendvps_avx(auVar70,auVar31._0_16_,auVar61);
      auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
      auVar29 = vminps_avx(auVar29,auVar28);
      auVar63 = vshufpd_avx(auVar29,auVar29,1);
      auVar28 = vblendvps_avx(auVar70,auVar107._0_16_,auVar61);
      auVar29 = vminps_avx(auVar63,auVar29);
      auVar63 = vshufps_avx(auVar28,auVar28,0xb1);
      auVar28 = vminps_avx(auVar63,auVar28);
      auVar63 = vshufpd_avx(auVar28,auVar28,1);
      auVar28 = vminps_avx(auVar63,auVar28);
      auVar29 = vinsertps_avx(auVar29,auVar28,0x1c);
      auVar28 = vblendvps_avx(auVar70,auVar112._0_16_,auVar61);
      auVar63 = vshufps_avx(auVar28,auVar28,0xb1);
      auVar28 = vminps_avx(auVar63,auVar28);
      auVar63 = vshufpd_avx(auVar28,auVar28,1);
      auVar28 = vminps_avx(auVar63,auVar28);
      auVar47 = vinsertps_avx(auVar29,auVar28,0x20);
      auVar41._8_4_ = 0xff800000;
      auVar41._0_8_ = 0xff800000ff800000;
      auVar41._12_4_ = 0xff800000;
      auVar28 = vblendvps_avx(auVar41,auVar31._0_16_,auVar61);
      auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
      auVar29 = vmaxps_avx(auVar29,auVar28);
      auVar63 = vshufpd_avx(auVar29,auVar29,1);
      auVar28 = vblendvps_avx(auVar41,auVar107._0_16_,auVar61);
      auVar29 = vmaxps_avx(auVar63,auVar29);
      auVar63 = vshufps_avx(auVar28,auVar28,0xb1);
      auVar28 = vmaxps_avx(auVar63,auVar28);
      auVar63 = vshufpd_avx(auVar28,auVar28,1);
      auVar28 = vmaxps_avx(auVar63,auVar28);
      auVar29 = vinsertps_avx(auVar29,auVar28,0x1c);
      auVar28 = vblendvps_avx(auVar41,auVar112._0_16_,auVar61);
      auVar63 = vshufps_avx(auVar28,auVar28,0xb1);
      auVar28 = vmaxps_avx(auVar63,auVar28);
      auVar63 = vshufpd_avx(auVar28,auVar28,1);
      auVar28 = vmaxps_avx(auVar63,auVar28);
      auVar53 = vinsertps_avx(auVar29,auVar28,0x20);
      auVar54 = vcmpps_avx(auVar47,_DAT_01feba10,5);
      auVar28 = vblendvps_avx(auVar53,auVar47,auVar54);
      auVar29 = vmovshdup_avx(auVar28);
      stack_node[0xbb].ptr = (ulong)(auVar29._0_4_ < 0.0) << 4 | 0x20;
      auVar29 = vshufpd_avx(auVar28,auVar28,1);
      uVar21 = (ulong)(auVar29._0_4_ < 0.0) << 4 | 0x40;
      stack_node[0xba].ptr = stack_node[0xbb].ptr ^ 0x10;
      auVar29 = vblendvps_avx(auVar70,auVar102._0_16_,auVar61);
      auVar63 = vshufps_avx(auVar29,auVar29,0xb1);
      auVar29 = vminps_avx(auVar63,auVar29);
      auVar63 = vshufpd_avx(auVar29,auVar29,1);
      auVar63 = vminps_avx(auVar63,auVar29);
      auVar29 = vblendvps_avx(auVar70,auVar106._0_16_,auVar61);
      auVar42 = vshufps_avx(auVar29,auVar29,0xb1);
      auVar29 = vminps_avx(auVar42,auVar29);
      auVar42 = vshufpd_avx(auVar29,auVar29,1);
      auVar29 = vminps_avx(auVar42,auVar29);
      auVar63 = vinsertps_avx(auVar63,auVar29,0x1c);
      auVar29 = vblendvps_avx(auVar70,auVar111._0_16_,auVar61);
      auVar42 = vshufps_avx(auVar29,auVar29,0xb1);
      auVar29 = vminps_avx(auVar42,auVar29);
      auVar42 = vshufpd_avx(auVar29,auVar29,1);
      auVar29 = vminps_avx(auVar42,auVar29);
      auVar63 = vinsertps_avx(auVar63,auVar29,0x20);
      auVar29 = vblendvps_avx(auVar41,auVar102._0_16_,auVar61);
      auVar42 = vshufps_avx(auVar29,auVar29,0xb1);
      auVar29 = vmaxps_avx(auVar42,auVar29);
      auVar42 = vshufpd_avx(auVar29,auVar29,1);
      auVar42 = vmaxps_avx(auVar42,auVar29);
      auVar29 = vblendvps_avx(auVar41,auVar106._0_16_,auVar61);
      auVar62 = vshufps_avx(auVar29,auVar29,0xb1);
      auVar29 = vmaxps_avx(auVar62,auVar29);
      auVar62 = vshufpd_avx(auVar29,auVar29,1);
      auVar29 = vmaxps_avx(auVar62,auVar29);
      auVar42 = vinsertps_avx(auVar42,auVar29,0x1c);
      auVar29 = vblendvps_avx(auVar41,auVar111._0_16_,auVar61);
      auVar62 = vshufps_avx(auVar29,auVar29,0xb1);
      auVar29 = vmaxps_avx(auVar62,auVar29);
      auVar62 = vshufpd_avx(auVar29,auVar29,1);
      auVar29 = vmaxps_avx(auVar62,auVar29);
      auVar42 = vinsertps_avx(auVar42,auVar29,0x20);
      auVar29 = vblendvps_avx(auVar42,auVar63,auVar54);
      auVar63 = vblendvps_avx(auVar63,auVar42,auVar54);
      auVar42 = vblendvps_avx(auVar41,stack_node._1520_16_,auVar61);
      auVar62 = vshufps_avx(auVar42,auVar42,0xb1);
      stack_node[0xa4].ptr = auVar42._0_8_;
      stack_node[0xa5].ptr = auVar42._8_8_;
      auVar62 = vmaxps_avx(auVar62,auVar42);
      auVar60 = vshufpd_avx(auVar62,auVar62,1);
      auVar42 = vblendvps_avx(auVar70,stack_node._1536_16_,auVar61);
      auVar61 = vshufps_avx(auVar42,auVar42,0xb1);
      stack_node[0xea].ptr = auVar42._0_8_;
      stack_node[0xeb].ptr = auVar42._8_8_;
      auVar61 = vminps_avx(auVar61,auVar42);
      auVar62 = vmaxss_avx(auVar60,auVar62);
      auVar42 = vblendvps_avx(auVar47,auVar53,auVar54);
      auVar54._0_4_ = auVar63._0_4_ * auVar28._0_4_;
      auVar54._4_4_ = auVar63._4_4_ * auVar28._4_4_;
      auVar54._8_4_ = auVar63._8_4_ * auVar28._8_4_;
      auVar54._12_4_ = auVar63._12_4_ * auVar28._12_4_;
      auVar63._0_4_ = auVar29._0_4_ * auVar42._0_4_;
      auVar63._4_4_ = auVar29._4_4_ * auVar42._4_4_;
      auVar63._8_4_ = auVar29._8_4_ * auVar42._8_4_;
      auVar63._12_4_ = auVar29._12_4_ * auVar42._12_4_;
      uVar16 = (ulong)(auVar28._0_4_ < 0.0) * 0x10;
      stack_node[0xec].ptr = *(size_t *)(stack_node[0xb4].ptr + 0x70);
      stack_node[0xed].ptr._0_4_ = 0;
      auVar29 = vshufps_avx(auVar28,auVar28,0);
      stack_node[0xe8].ptr = auVar29._0_8_;
      stack_node[0xe9].ptr = auVar29._8_8_;
      auVar29 = vshufps_avx(auVar54,auVar54,0);
      stack_node[0xe6].ptr = auVar29._0_8_;
      stack_node[0xe7].ptr = auVar29._8_8_;
      auVar29 = vshufps_avx(auVar28,auVar28,0x55);
      stack_node[0xe4].ptr = auVar29._0_8_;
      stack_node[0xe5].ptr = auVar29._8_8_;
      auVar29 = vshufps_avx(auVar54,auVar54,0x55);
      stack_node[0xe2].ptr = auVar29._0_8_;
      stack_node[0xe3].ptr = auVar29._8_8_;
      auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
      stack_node[0xe0].ptr = auVar28._0_8_;
      stack_node[0xe1].ptr = auVar28._8_8_;
      auVar28 = vshufps_avx(auVar54,auVar54,0xaa);
      stack_node[0xde].ptr = auVar28._0_8_;
      stack_node[0xdf].ptr = auVar28._8_8_;
      auVar28 = vshufps_avx(auVar42,auVar42,0);
      stack_node[0xdc].ptr = auVar28._0_8_;
      stack_node[0xdd].ptr = auVar28._8_8_;
      auVar28 = vshufps_avx(auVar63,auVar63,0);
      stack_node[0xda].ptr = auVar28._0_8_;
      stack_node[0xdb].ptr = auVar28._8_8_;
      auVar28 = vshufps_avx(auVar42,auVar42,0x55);
      stack_node[0xd8].ptr = auVar28._0_8_;
      stack_node[0xd9].ptr = auVar28._8_8_;
      auVar28 = vshufps_avx(auVar61,auVar61,0);
      auVar29 = vshufps_avx(auVar61,auVar61,0xaa);
      auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar28 = vminps_avx(auVar29,auVar28);
      stack_node[0xd6].ptr = auVar28._0_8_;
      stack_node[0xd7].ptr = auVar28._8_8_;
      auVar28 = vshufps_avx(auVar63,auVar63,0x55);
      stack_node[0xd4].ptr = auVar28._0_8_;
      stack_node[0xd5].ptr = auVar28._8_8_;
      auVar28 = vshufps_avx(auVar42,auVar42,0xaa);
      stack_node[0xd2].ptr = auVar28._0_8_;
      stack_node[0xd3].ptr = auVar28._8_8_;
      auVar28 = vshufps_avx(auVar63,auVar63,0xaa);
      stack_node[0xd0].ptr = auVar28._0_8_;
      stack_node[0xd1].ptr = auVar28._8_8_;
      pNVar22 = stack_node + 0xee;
      do {
        auVar28 = vshufps_avx(auVar62,auVar62,0);
        stack_node[0xb0].ptr = auVar28._0_8_;
        stack_node[0xb1].ptr = auVar28._8_8_;
LAB_0037be13:
        do {
          do {
            if (pNVar22 == stack_node + 0xec) {
              if (stack_node[0xb5].ptr == 0) {
                return;
              }
              goto LAB_0037bac3;
            }
            uVar17 = (undefined4)pNVar22[-1].ptr;
            auVar29._4_4_ = uVar17;
            auVar29._0_4_ = uVar17;
            auVar29._8_4_ = uVar17;
            auVar29._12_4_ = uVar17;
            auVar32 = ZEXT1664(auVar29);
            pNVar22 = pNVar22 + -2;
            auVar28 = vcmpps_avx(auVar29,stack_node._1312_16_,1);
          } while ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                    (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   -1 < auVar28[0xf]);
          sVar13 = pNVar22->ptr;
          while ((sVar13 & 8) == 0) {
            pfVar4 = (float *)(sVar13 + 0x20 + uVar16);
            auVar42._0_4_ = (float)stack_node[0xe8].ptr * *pfVar4;
            auVar42._4_4_ = stack_node[0xe8].ptr._4_4_ * pfVar4[1];
            auVar42._8_4_ = (float)stack_node[0xe9].ptr * pfVar4[2];
            auVar42._12_4_ = stack_node[0xe9].ptr._4_4_ * pfVar4[3];
            pfVar4 = (float *)(sVar13 + 0x20 + stack_node[0xbb].ptr);
            auVar47._0_4_ = (float)stack_node[0xe4].ptr * *pfVar4;
            auVar47._4_4_ = stack_node[0xe4].ptr._4_4_ * pfVar4[1];
            auVar47._8_4_ = (float)stack_node[0xe5].ptr * pfVar4[2];
            auVar47._12_4_ = stack_node[0xe5].ptr._4_4_ * pfVar4[3];
            auVar28 = vsubps_avx(auVar42,stack_node._1840_16_);
            auVar29 = vsubps_avx(auVar47,stack_node._1808_16_);
            pfVar4 = (float *)(sVar13 + 0x20 + uVar21);
            auVar55._0_4_ = (float)stack_node[0xe0].ptr * *pfVar4;
            auVar55._4_4_ = stack_node[0xe0].ptr._4_4_ * pfVar4[1];
            auVar55._8_4_ = (float)stack_node[0xe1].ptr * pfVar4[2];
            auVar55._12_4_ = stack_node[0xe1].ptr._4_4_ * pfVar4[3];
            auVar28 = vpmaxsd_avx(auVar28,auVar29);
            auVar29 = vsubps_avx(auVar55,stack_node._1776_16_);
            auVar29 = vpmaxsd_avx(auVar29,stack_node._1712_16_);
            auVar28 = vpmaxsd_avx(auVar28,auVar29);
            pfVar4 = (float *)(sVar13 + 0x20 + (uVar16 ^ 0x10));
            auVar48._0_4_ = (float)stack_node[0xdc].ptr * *pfVar4;
            auVar48._4_4_ = stack_node[0xdc].ptr._4_4_ * pfVar4[1];
            auVar48._8_4_ = (float)stack_node[0xdd].ptr * pfVar4[2];
            auVar48._12_4_ = stack_node[0xdd].ptr._4_4_ * pfVar4[3];
            pfVar4 = (float *)(sVar13 + 0x20 + stack_node[0xba].ptr);
            auVar56._0_4_ = (float)stack_node[0xd8].ptr * *pfVar4;
            auVar56._4_4_ = stack_node[0xd8].ptr._4_4_ * pfVar4[1];
            auVar56._8_4_ = (float)stack_node[0xd9].ptr * pfVar4[2];
            auVar56._12_4_ = stack_node[0xd9].ptr._4_4_ * pfVar4[3];
            auVar29 = vsubps_avx(auVar48,stack_node._1744_16_);
            auVar63 = vsubps_avx(auVar56,stack_node._1696_16_);
            pfVar4 = (float *)(sVar13 + 0x20 + (uVar21 ^ 0x10));
            auVar64._0_4_ = (float)stack_node[0xd2].ptr * *pfVar4;
            auVar64._4_4_ = stack_node[0xd2].ptr._4_4_ * pfVar4[1];
            auVar64._8_4_ = (float)stack_node[0xd3].ptr * pfVar4[2];
            auVar64._12_4_ = stack_node[0xd3].ptr._4_4_ * pfVar4[3];
            auVar29 = vpminsd_avx(auVar29,auVar63);
            auVar63 = vsubps_avx(auVar64,stack_node._1664_16_);
            auVar63 = vpminsd_avx(auVar63,stack_node._1408_16_);
            auVar29 = vpminsd_avx(auVar29,auVar63);
            stack_node[0xb2].ptr = auVar28._0_8_;
            stack_node[0xb3].ptr = auVar28._8_8_;
            auVar28 = vcmpps_avx(auVar28,auVar29,2);
            uVar9 = vmovmskps_avx(auVar28);
            if (uVar9 == 0) {
              bVar8 = false;
              sVar11 = sVar13;
            }
            else {
              uVar18 = (ulong)(uVar9 & 0xff);
              auVar32 = ZEXT1664(auVar99._0_16_);
              uVar20 = 0;
              sVar10 = 8;
              do {
                lVar24 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
                uVar17 = *(undefined4 *)(sVar13 + 0x20 + lVar24 * 4);
                auVar43._4_4_ = uVar17;
                auVar43._0_4_ = uVar17;
                auVar43._8_4_ = uVar17;
                auVar43._12_4_ = uVar17;
                auVar28 = vsubps_avx(auVar43,auVar102._0_16_);
                auVar44._0_4_ = auVar31._0_4_ * auVar28._0_4_;
                auVar44._4_4_ = auVar31._4_4_ * auVar28._4_4_;
                auVar44._8_4_ = auVar31._8_4_ * auVar28._8_4_;
                auVar44._12_4_ = auVar31._12_4_ * auVar28._12_4_;
                uVar17 = *(undefined4 *)(sVar13 + 0x40 + lVar24 * 4);
                auVar49._4_4_ = uVar17;
                auVar49._0_4_ = uVar17;
                auVar49._8_4_ = uVar17;
                auVar49._12_4_ = uVar17;
                auVar28 = vsubps_avx(auVar49,auVar106._0_16_);
                auVar50._0_4_ = auVar107._0_4_ * auVar28._0_4_;
                auVar50._4_4_ = auVar107._4_4_ * auVar28._4_4_;
                auVar50._8_4_ = auVar107._8_4_ * auVar28._8_4_;
                auVar50._12_4_ = auVar107._12_4_ * auVar28._12_4_;
                uVar17 = *(undefined4 *)(sVar13 + 0x60 + lVar24 * 4);
                auVar57._4_4_ = uVar17;
                auVar57._0_4_ = uVar17;
                auVar57._8_4_ = uVar17;
                auVar57._12_4_ = uVar17;
                auVar28 = vsubps_avx(auVar57,auVar111._0_16_);
                auVar58._0_4_ = auVar112._0_4_ * auVar28._0_4_;
                auVar58._4_4_ = auVar112._4_4_ * auVar28._4_4_;
                auVar58._8_4_ = auVar112._8_4_ * auVar28._8_4_;
                auVar58._12_4_ = auVar112._12_4_ * auVar28._12_4_;
                uVar17 = *(undefined4 *)(sVar13 + 0x30 + lVar24 * 4);
                auVar65._4_4_ = uVar17;
                auVar65._0_4_ = uVar17;
                auVar65._8_4_ = uVar17;
                auVar65._12_4_ = uVar17;
                auVar28 = vsubps_avx(auVar65,auVar102._0_16_);
                auVar66._0_4_ = auVar31._0_4_ * auVar28._0_4_;
                auVar66._4_4_ = auVar31._4_4_ * auVar28._4_4_;
                auVar66._8_4_ = auVar31._8_4_ * auVar28._8_4_;
                auVar66._12_4_ = auVar31._12_4_ * auVar28._12_4_;
                uVar17 = *(undefined4 *)(sVar13 + 0x50 + lVar24 * 4);
                auVar72._4_4_ = uVar17;
                auVar72._0_4_ = uVar17;
                auVar72._8_4_ = uVar17;
                auVar72._12_4_ = uVar17;
                auVar28 = vsubps_avx(auVar72,auVar106._0_16_);
                auVar73._0_4_ = auVar107._0_4_ * auVar28._0_4_;
                auVar73._4_4_ = auVar107._4_4_ * auVar28._4_4_;
                auVar73._8_4_ = auVar107._8_4_ * auVar28._8_4_;
                auVar73._12_4_ = auVar107._12_4_ * auVar28._12_4_;
                uVar17 = *(undefined4 *)(sVar13 + 0x70 + lVar24 * 4);
                auVar77._4_4_ = uVar17;
                auVar77._0_4_ = uVar17;
                auVar77._8_4_ = uVar17;
                auVar77._12_4_ = uVar17;
                auVar28 = vsubps_avx(auVar77,auVar111._0_16_);
                auVar78._0_4_ = auVar112._0_4_ * auVar28._0_4_;
                auVar78._4_4_ = auVar112._4_4_ * auVar28._4_4_;
                auVar78._8_4_ = auVar112._8_4_ * auVar28._8_4_;
                auVar78._12_4_ = auVar112._12_4_ * auVar28._12_4_;
                auVar28 = vpminsd_avx(auVar44,auVar66);
                auVar29 = vpminsd_avx(auVar50,auVar73);
                auVar28 = vpmaxsd_avx(auVar28,auVar29);
                auVar42 = vpminsd_avx(auVar58,auVar78);
                auVar29 = vpmaxsd_avx(auVar44,auVar66);
                auVar63 = vpmaxsd_avx(auVar50,auVar73);
                auVar54 = vpminsd_avx(auVar29,auVar63);
                auVar29 = vpmaxsd_avx(auVar58,auVar78);
                auVar63 = vpmaxsd_avx(auVar42,stack_node._1872_16_);
                auVar28 = vpmaxsd_avx(auVar28,auVar63);
                auVar29 = vpminsd_avx(auVar29,stack_node._1312_16_);
                auVar29 = vpminsd_avx(auVar54,auVar29);
                auVar28 = vcmpps_avx(auVar28,auVar29,2);
                sVar11 = sVar10;
                if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar28[0xf] < '\0') {
                  uVar17 = *(undefined4 *)((long)&stack_node[0xb2].ptr + lVar24 * 4);
                  auVar45._4_4_ = uVar17;
                  auVar45._0_4_ = uVar17;
                  auVar45._8_4_ = uVar17;
                  auVar45._12_4_ = uVar17;
                  sVar11 = *(size_t *)(sVar13 + lVar24 * 8);
                  auVar29 = auVar32._0_16_;
                  auVar28 = vcmpps_avx(auVar45,auVar29,1);
                  if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar28[0xf]) {
                    pNVar22->ptr = sVar11;
                    sVar11 = sVar10;
                  }
                  else {
                    if (sVar10 == 8) {
                      auVar32 = ZEXT1664(auVar45);
                      goto LAB_0037c029;
                    }
                    pNVar22->ptr = sVar10;
                    auVar32 = ZEXT1664(auVar45);
                    auVar45 = auVar29;
                  }
                  uVar20 = uVar20 + 1;
                  *(int *)&pNVar22[1].ptr = auVar45._0_4_;
                  pNVar22 = pNVar22 + 2;
                }
LAB_0037c029:
                uVar18 = uVar18 & uVar18 - 1;
                sVar10 = sVar11;
              } while (uVar18 != 0);
              if (sVar11 == 8) {
                bVar8 = false;
              }
              else {
                bVar8 = true;
                if (1 < uVar20) {
                  pNVar3 = pNVar22 + -4;
                  pNVar1 = pNVar22 + -2;
                  if ((uint)pNVar22[-3].ptr < (uint)pNVar22[-1].ptr) {
                    stack_node[0xa6].ptr = pNVar3->ptr;
                    stack_node[0xa7].ptr = pNVar22[-3].ptr;
                    *(int *)&pNVar22[-3].ptr = (int)pNVar22[-1].ptr;
                    pNVar3->ptr = pNVar1->ptr;
                    pNVar1->ptr = stack_node[0xa6].ptr;
                    *(undefined4 *)&pNVar22[-1].ptr = (undefined4)stack_node[0xa7].ptr;
                  }
                  stack_node[0xa3].ptr = 8;
                  if (uVar20 != 2) {
                    pNVar2 = pNVar22 + -6;
                    if ((uint)pNVar22[-5].ptr < (uint)pNVar22[-1].ptr) {
                      stack_node[0xa6].ptr = pNVar2->ptr;
                      stack_node[0xa7].ptr = pNVar22[-5].ptr;
                      *(int *)&pNVar22[-5].ptr = (int)pNVar22[-1].ptr;
                      pNVar2->ptr = pNVar1->ptr;
                      pNVar1->ptr = stack_node[0xa6].ptr;
                      *(undefined4 *)&pNVar22[-1].ptr = (undefined4)stack_node[0xa7].ptr;
                    }
                    stack_node[0xa3].ptr = 8;
                    if ((uint)pNVar22[-5].ptr < (uint)pNVar22[-3].ptr) {
                      stack_node[0xa6].ptr = pNVar2->ptr;
                      stack_node[0xa7].ptr = pNVar22[-5].ptr;
                      *(int *)&pNVar22[-5].ptr = (int)pNVar22[-3].ptr;
                      pNVar2->ptr = pNVar3->ptr;
                      pNVar3->ptr = stack_node[0xa6].ptr;
                      *(undefined4 *)&pNVar22[-3].ptr = (undefined4)stack_node[0xa7].ptr;
                    }
                  }
                }
              }
            }
            sVar13 = sVar11;
            if (!bVar8) goto LAB_0037be13;
          }
          auVar28 = vcmpps_avx(stack_node._1312_16_,auVar32._0_16_,6);
          auVar32 = ZEXT1664(auVar28);
          if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar28[0xf]) goto LAB_0037be13;
          stack_node[0xb8].ptr = (ulong)((uint)sVar13 & 0xf) - 8;
          if (stack_node[0xb8].ptr != 0) {
            stack_node[0xb9].ptr = 0;
            stack_node[0xce].ptr = auVar28._0_8_;
            stack_node[0xcf].ptr = auVar28._8_8_;
            do {
              stack_node[0xab].ptr._4_4_ =
                   *(uint *)((sVar13 & 0xfffffffffffffff0) + stack_node[0xb9].ptr * 8);
              stack_node[0xac].ptr =
                   (size_t)(context->scene->geometries).items[stack_node[0xab].ptr._4_4_].ptr;
              uVar9 = ((Geometry *)stack_node[0xac].ptr)->mask;
              auVar30._4_4_ = uVar9;
              auVar30._0_4_ = uVar9;
              auVar30._8_4_ = uVar9;
              auVar30._12_4_ = uVar9;
              auVar28 = vandps_avx(auVar30,*(undefined1 (*) [16])(ray + 0x90));
              auVar28 = vpcmpeqd_avx(auVar28,_DAT_01feba10);
              auVar29 = auVar32._0_16_ & ~auVar28;
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') {
                stack_node._1424_16_ = vandnps_avx(auVar28,auVar32._0_16_);
                stack_node[0xa8].ptr._0_4_ =
                     *(undefined4 *)((sVar13 & 0xfffffffffffffff0) + 4 + stack_node[0xb9].ptr * 8);
                stack_node[0xa6].ptr = (size_t)(stack_node + 0xb2);
                stack_node[0xa7].ptr = (size_t)((Geometry *)stack_node[0xac].ptr)->userPtr;
                stack_node[0xa9].ptr = (size_t)context->user;
                stack_node[0xab].ptr._0_4_ = 4;
                stack_node[0xad].ptr = 0;
                stack_node[0xae].ptr = (size_t)context->args;
                pp_Var12 = (_func_int **)((RTCIntersectArguments *)stack_node[0xae].ptr)->intersect;
                if (pp_Var12 == (_func_int **)0x0) {
                  pp_Var12 = (((Geometry *)(stack_node[0xac].ptr + 0x60))->super_RefCount).
                             _vptr_RefCount;
                }
                stack_node[0xa3].ptr = 0x37c206;
                stack_node[0xaa].ptr = (size_t)ray;
                (*(code *)pp_Var12)((RTCIntersectFunctionNArguments *)(stack_node + 0xa6));
                auVar102 = ZEXT1664(stack_node._1632_16_);
                auVar106 = ZEXT1664(stack_node._1616_16_);
                auVar111 = ZEXT1664(stack_node._1600_16_);
                auVar31 = ZEXT1664(stack_node._1584_16_);
                auVar107 = ZEXT1664(stack_node._1568_16_);
                auVar112 = ZEXT1664(stack_node._1552_16_);
                auVar99 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                stack_node[0xa3].ptr = 8;
                auVar32 = ZEXT1664(stack_node._1648_16_);
                context = (RayQueryContext *)stack_node[0xb7];
                ray = (RayHitK<4> *)stack_node[0xb6];
              }
              auVar28 = auVar32._0_16_;
              stack_node[0xb9].ptr = stack_node[0xb9].ptr + 1;
            } while (stack_node[0xb8].ptr != stack_node[0xb9].ptr);
          }
          auVar29 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),stack_node._1312_16_,1);
          auVar29 = auVar28 & auVar29;
        } while ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 -1 < auVar29[0xf]);
        auVar28 = vblendvps_avx(stack_node._1312_16_,*(undefined1 (*) [16])(ray + 0x80),auVar28);
        auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
        stack_node[0xa4].ptr = auVar28._0_8_;
        stack_node[0xa5].ptr = auVar28._8_8_;
        auVar28 = vmaxps_avx(auVar29,auVar28);
        auVar29 = vshufpd_avx(auVar28,auVar28,1);
        auVar62 = vmaxss_avx(auVar29,auVar28);
      } while( true );
    }
    auVar28 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar29 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar28);
    iVar15 = vmovmskps_avx(auVar29);
    uVar16 = CONCAT44((int)((ulong)This >> 0x20),iVar15);
    if (iVar15 != 0) {
      auVar63 = *(undefined1 (*) [16])(ray + 0x40);
      auVar33._8_4_ = 0x7fffffff;
      auVar33._0_8_ = 0x7fffffff7fffffff;
      auVar33._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx(auVar63,auVar33);
      auVar67._8_4_ = 0x219392ef;
      auVar67._0_8_ = 0x219392ef219392ef;
      auVar67._12_4_ = 0x219392ef;
      auVar42 = vcmpps_avx(auVar42,auVar67,1);
      auVar54 = vblendvps_avx(auVar63,auVar67,auVar42);
      auVar42 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar33);
      auVar42 = vcmpps_avx(auVar42,auVar67,1);
      auVar47 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar67,auVar42);
      auVar42 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar33);
      auVar42 = vcmpps_avx(auVar42,auVar67,1);
      auVar42 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar67,auVar42);
      auVar53 = vrcpps_avx(auVar54);
      fVar82 = auVar53._0_4_;
      auVar51._0_4_ = auVar54._0_4_ * fVar82;
      fVar85 = auVar53._4_4_;
      auVar51._4_4_ = auVar54._4_4_ * fVar85;
      fVar86 = auVar53._8_4_;
      auVar51._8_4_ = auVar54._8_4_ * fVar86;
      fVar87 = auVar53._12_4_;
      auVar51._12_4_ = auVar54._12_4_ * fVar87;
      auVar83._8_4_ = 0x3f800000;
      auVar83._0_8_ = &DAT_3f8000003f800000;
      auVar83._12_4_ = 0x3f800000;
      auVar53 = vsubps_avx(auVar83,auVar51);
      auVar54 = vrcpps_avx(auVar47);
      fVar88 = auVar54._0_4_;
      auVar68._0_4_ = auVar47._0_4_ * fVar88;
      fVar90 = auVar54._4_4_;
      auVar68._4_4_ = auVar47._4_4_ * fVar90;
      fVar91 = auVar54._8_4_;
      auVar68._8_4_ = auVar47._8_4_ * fVar91;
      fVar92 = auVar54._12_4_;
      auVar68._12_4_ = auVar47._12_4_ * fVar92;
      auVar47 = vsubps_avx(auVar83,auVar68);
      auVar54 = vrcpps_avx(auVar42);
      fVar93 = auVar54._0_4_;
      auVar80._0_4_ = auVar42._0_4_ * fVar93;
      fVar95 = auVar54._4_4_;
      auVar80._4_4_ = auVar42._4_4_ * fVar95;
      fVar96 = auVar54._8_4_;
      auVar80._8_4_ = auVar42._8_4_ * fVar96;
      fVar97 = auVar54._12_4_;
      auVar80._12_4_ = auVar42._12_4_ * fVar97;
      auVar54 = vsubps_avx(auVar83,auVar80);
      auVar62 = ZEXT816(0);
      auVar63 = vcmpps_avx(auVar63,auVar62,1);
      auVar94._8_4_ = 1;
      auVar94._0_8_ = 0x100000001;
      auVar94._12_4_ = 1;
      auVar63 = vandps_avx(auVar94,auVar63);
      auVar42 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar62,1);
      auVar98._8_4_ = 2;
      auVar98._0_8_ = 0x200000002;
      auVar98._12_4_ = 2;
      auVar42 = vandps_avx(auVar42,auVar98);
      auVar99 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar42 = vorps_avx(auVar42,auVar63);
      auVar63 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar62,1);
      auVar84._8_4_ = 4;
      auVar84._0_8_ = 0x400000004;
      auVar84._12_4_ = 4;
      auVar63 = vandps_avx(auVar84,auVar63);
      auVar102 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar106 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar28 = vpor_avx(auVar29 ^ auVar28,auVar63);
      local_17d8 = vpor_avx(auVar42,auVar28);
      do {
        lVar24 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        uVar17 = *(undefined4 *)(local_17d8 + lVar24 * 4);
        auVar89._4_4_ = uVar17;
        auVar89._0_4_ = uVar17;
        auVar89._8_4_ = uVar17;
        auVar89._12_4_ = uVar17;
        auVar28 = vpcmpeqd_avx(auVar89,local_17d8);
        uVar17 = vmovmskps_avx(auVar28);
        uVar16 = uVar16 & ~CONCAT44((int)((ulong)lVar24 >> 0x20),uVar17);
      } while (uVar16 != 0);
      auVar28 = vpcmpeqd_avx(local_17d8,local_17d8);
      auVar63 = vpcmpeqd_avx(auVar28,(undefined1  [16])valid_i->field_0);
      fVar82 = fVar82 + auVar53._0_4_ * fVar82;
      fVar85 = fVar85 + auVar53._4_4_ * fVar85;
      fVar86 = fVar86 + auVar53._8_4_ * fVar86;
      fVar87 = fVar87 + auVar53._12_4_ * fVar87;
      fVar88 = fVar88 + fVar88 * auVar47._0_4_;
      fVar90 = fVar90 + fVar90 * auVar47._4_4_;
      fVar91 = fVar91 + fVar91 * auVar47._8_4_;
      fVar92 = fVar92 + fVar92 * auVar47._12_4_;
      fVar93 = auVar54._0_4_ * fVar93 + fVar93;
      fVar95 = auVar54._4_4_ * fVar95 + fVar95;
      fVar96 = auVar54._8_4_ * fVar96 + fVar96;
      fVar97 = auVar54._12_4_ * fVar97 + fVar97;
      auVar28 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      auVar29 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar111 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar28,auVar63);
      auVar34._8_4_ = 0xff800000;
      auVar34._0_8_ = 0xff800000ff800000;
      auVar34._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar34,auVar29,auVar63);
      pNVar22 = stack_node + 2;
      paVar23 = &stack_near[2].field_0;
      local_17d8 = vorps_avx(auVar63,local_17d8);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      stack_near[1].field_0 = local_16f8;
      do {
        paVar23 = paVar23 + -1;
        pNVar3 = pNVar22 + -1;
        pNVar22 = pNVar22 + -1;
        bVar8 = true;
        if (pNVar3->ptr != 0xfffffffffffffff8) {
          auVar31 = ZEXT1664((undefined1  [16])*paVar23);
          auVar28 = vcmpps_avx((undefined1  [16])*paVar23,(undefined1  [16])bi_8.field_0,1);
          sVar13 = pNVar3->ptr;
          if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar28[0xf] < '\0') {
            do {
              local_1708 = auVar99._0_16_;
              local_1718 = auVar102._0_16_;
              local_1728 = auVar106._0_16_;
              if ((sVar13 & 8) != 0) {
                if (sVar13 == 0xfffffffffffffff8) goto LAB_00332e75;
                auVar28 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar31._0_16_,6);
                auVar31 = ZEXT1664(auVar28);
                if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar28[0xf] < '\0') {
                  local_17b8 = (ulong)((uint)sVar13 & 0xf) - 8;
                  if (local_17b8 != 0) {
                    lVar24 = 0;
                    local_17c0 = ray;
                    local_1738 = fVar82;
                    fStack_1734 = fVar85;
                    fStack_1730 = fVar86;
                    fStack_172c = fVar87;
                    local_1748 = fVar88;
                    fStack_1744 = fVar90;
                    fStack_1740 = fVar91;
                    fStack_173c = fVar92;
                    local_1758 = fVar93;
                    fStack_1754 = fVar95;
                    fStack_1750 = fVar96;
                    fStack_174c = fVar97;
                    local_1768 = auVar28;
                    do {
                      local_17b0.geomID = *(uint *)((sVar13 & 0xfffffffffffffff0) + lVar24 * 8);
                      local_1780 = (context->scene->geometries).items[local_17b0.geomID].ptr;
                      uVar9 = local_1780->mask;
                      auVar27._4_4_ = uVar9;
                      auVar27._0_4_ = uVar9;
                      auVar27._8_4_ = uVar9;
                      auVar27._12_4_ = uVar9;
                      auVar28 = vandps_avx(auVar27,*(undefined1 (*) [16])(ray + 0x90));
                      auVar28 = vpcmpeqd_avx(auVar28,_DAT_01feba10);
                      auVar29 = auVar31._0_16_ & ~auVar28;
                      if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar29[0xf] < '\0') {
                        mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vandnps_avx(auVar28,auVar31._0_16_);
                        local_17b0.primID =
                             *(uint *)((sVar13 & 0xfffffffffffffff0) + 4 + lVar24 * 8);
                        local_17b0.valid = (int *)&mask;
                        local_17b0.geometryUserPtr = local_1780->userPtr;
                        local_17b0.context = context->user;
                        local_17b0.N = 4;
                        local_1778 = 0;
                        local_1770 = context->args;
                        pp_Var12 = (_func_int **)local_1770->intersect;
                        if (pp_Var12 == (_func_int **)0x0) {
                          pp_Var12 = local_1780[1].super_RefCount._vptr_RefCount;
                        }
                        local_17b0.rayhit = (RTCRayHitN *)ray;
                        (*(code *)pp_Var12)(&local_17b0);
                        auVar99 = ZEXT1664(local_1708);
                        auVar102 = ZEXT1664(local_1718);
                        auVar106 = ZEXT1664(local_1728);
                        auVar111 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                        auVar31 = ZEXT1664(local_1768);
                        ray = local_17c0;
                        fVar82 = local_1738;
                        fVar85 = fStack_1734;
                        fVar86 = fStack_1730;
                        fVar87 = fStack_172c;
                        fVar88 = local_1748;
                        fVar90 = fStack_1744;
                        fVar91 = fStack_1740;
                        fVar92 = fStack_173c;
                        fVar93 = local_1758;
                        fVar95 = fStack_1754;
                        fVar96 = fStack_1750;
                        fVar97 = fStack_174c;
                      }
                      auVar28 = auVar31._0_16_;
                      lVar24 = lVar24 + 1;
                    } while (local_17b8 != lVar24);
                  }
                  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                 vblendvps_avx((undefined1  [16])bi_8.field_0,
                                               *(undefined1 (*) [16])(ray + 0x80),auVar28);
                }
                break;
              }
              uVar21 = 0;
              auVar31 = ZEXT1664(auVar111._0_16_);
              sVar11 = 8;
              uVar16 = 0;
              do {
                sVar10 = *(size_t *)((sVar13 & 0xfffffffffffffff0) + uVar16 * 8);
                sVar14 = sVar11;
                if (sVar10 != 8) {
                  uVar17 = *(undefined4 *)(sVar13 + 0x20 + uVar16 * 4);
                  auVar35._4_4_ = uVar17;
                  auVar35._0_4_ = uVar17;
                  auVar35._8_4_ = uVar17;
                  auVar35._12_4_ = uVar17;
                  auVar28 = vsubps_avx(auVar35,local_1708);
                  auVar46._0_4_ = fVar82 * auVar28._0_4_;
                  auVar46._4_4_ = fVar85 * auVar28._4_4_;
                  auVar46._8_4_ = fVar86 * auVar28._8_4_;
                  auVar46._12_4_ = fVar87 * auVar28._12_4_;
                  uVar17 = *(undefined4 *)(sVar13 + 0x40 + uVar16 * 4);
                  auVar36._4_4_ = uVar17;
                  auVar36._0_4_ = uVar17;
                  auVar36._8_4_ = uVar17;
                  auVar36._12_4_ = uVar17;
                  auVar28 = vsubps_avx(auVar36,local_1718);
                  auVar52._0_4_ = fVar88 * auVar28._0_4_;
                  auVar52._4_4_ = fVar90 * auVar28._4_4_;
                  auVar52._8_4_ = fVar91 * auVar28._8_4_;
                  auVar52._12_4_ = fVar92 * auVar28._12_4_;
                  uVar17 = *(undefined4 *)(sVar13 + 0x60 + uVar16 * 4);
                  auVar37._4_4_ = uVar17;
                  auVar37._0_4_ = uVar17;
                  auVar37._8_4_ = uVar17;
                  auVar37._12_4_ = uVar17;
                  auVar28 = vsubps_avx(auVar37,local_1728);
                  auVar59._0_4_ = fVar93 * auVar28._0_4_;
                  auVar59._4_4_ = fVar95 * auVar28._4_4_;
                  auVar59._8_4_ = fVar96 * auVar28._8_4_;
                  auVar59._12_4_ = fVar97 * auVar28._12_4_;
                  uVar17 = *(undefined4 *)(sVar13 + 0x30 + uVar16 * 4);
                  auVar38._4_4_ = uVar17;
                  auVar38._0_4_ = uVar17;
                  auVar38._8_4_ = uVar17;
                  auVar38._12_4_ = uVar17;
                  auVar28 = vsubps_avx(auVar38,local_1708);
                  auVar69._0_4_ = fVar82 * auVar28._0_4_;
                  auVar69._4_4_ = fVar85 * auVar28._4_4_;
                  auVar69._8_4_ = fVar86 * auVar28._8_4_;
                  auVar69._12_4_ = fVar87 * auVar28._12_4_;
                  uVar17 = *(undefined4 *)(sVar13 + 0x50 + uVar16 * 4);
                  auVar39._4_4_ = uVar17;
                  auVar39._0_4_ = uVar17;
                  auVar39._8_4_ = uVar17;
                  auVar39._12_4_ = uVar17;
                  auVar28 = vsubps_avx(auVar39,local_1718);
                  auVar74._0_4_ = fVar88 * auVar28._0_4_;
                  auVar74._4_4_ = fVar90 * auVar28._4_4_;
                  auVar74._8_4_ = fVar91 * auVar28._8_4_;
                  auVar74._12_4_ = fVar92 * auVar28._12_4_;
                  uVar17 = *(undefined4 *)(sVar13 + 0x70 + uVar16 * 4);
                  auVar40._4_4_ = uVar17;
                  auVar40._0_4_ = uVar17;
                  auVar40._8_4_ = uVar17;
                  auVar40._12_4_ = uVar17;
                  auVar28 = vsubps_avx(auVar40,local_1728);
                  auVar79._0_4_ = fVar93 * auVar28._0_4_;
                  auVar79._4_4_ = fVar95 * auVar28._4_4_;
                  auVar79._8_4_ = fVar96 * auVar28._8_4_;
                  auVar79._12_4_ = fVar97 * auVar28._12_4_;
                  auVar28 = vpminsd_avx(auVar46,auVar69);
                  auVar29 = vpminsd_avx(auVar52,auVar74);
                  auVar28 = vpmaxsd_avx(auVar28,auVar29);
                  auVar29 = vpminsd_avx(auVar59,auVar79);
                  auVar29 = vpmaxsd_avx(auVar28,auVar29);
                  auVar28 = vpmaxsd_avx(auVar46,auVar69);
                  auVar63 = vpmaxsd_avx(auVar52,auVar74);
                  auVar42 = vpminsd_avx(auVar28,auVar63);
                  auVar28 = vpmaxsd_avx(auVar59,auVar79);
                  auVar63 = vpmaxsd_avx(auVar29,(undefined1  [16])local_16f8);
                  auVar28 = vpminsd_avx(auVar28,(undefined1  [16])bi_8.field_0);
                  auVar28 = vpminsd_avx(auVar42,auVar28);
                  auVar28 = vcmpps_avx(auVar63,auVar28,2);
                  if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar28[0xf] < '\0') {
                    aVar5 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                            vblendvps_avx(auVar111._0_16_,auVar29,auVar28);
                    aVar26 = auVar31._0_16_;
                    auVar28 = vcmpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar26,1);
                    sVar19 = sVar10;
                    aVar6 = aVar26;
                    aVar7 = aVar5;
                    if (((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                          (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         -1 < auVar28[0xf]) ||
                       (sVar14 = sVar10, sVar19 = sVar11, aVar6 = aVar5, aVar7 = aVar26, sVar11 != 8
                       )) {
                      uVar21 = uVar21 + 1;
                      pNVar22->ptr = sVar19;
                      pNVar22 = pNVar22 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar23->v = aVar7;
                      paVar23 = paVar23 + 1;
                      auVar31 = ZEXT1664((undefined1  [16])aVar6);
                    }
                    else {
                      auVar31 = ZEXT1664((undefined1  [16])aVar5);
                    }
                  }
                }
              } while ((sVar10 != 8) &&
                      (bVar25 = uVar16 < 3, sVar11 = sVar14, uVar16 = uVar16 + 1, bVar25));
              if (1 < uVar21 && sVar14 != 8) {
                aVar5 = paVar23[-2];
                auVar28 = vcmpps_avx((undefined1  [16])aVar5,(undefined1  [16])paVar23[-1],1);
                if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar28[0xf] < '\0') {
                  paVar23[-2] = paVar23[-1];
                  paVar23[-1] = aVar5;
                  auVar28 = vpermilps_avx(*(undefined1 (*) [16])(pNVar22 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar22 + -2) = auVar28;
                }
                if (uVar21 != 2) {
                  aVar5 = paVar23[-3];
                  auVar28 = vcmpps_avx((undefined1  [16])aVar5,(undefined1  [16])paVar23[-1],1);
                  if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar28[0xf] < '\0') {
                    paVar23[-3] = paVar23[-1];
                    paVar23[-1] = aVar5;
                    sVar13 = pNVar22[-3].ptr;
                    pNVar22[-3].ptr = pNVar22[-1].ptr;
                    pNVar22[-1].ptr = sVar13;
                  }
                  aVar5 = paVar23[-3];
                  auVar28 = vcmpps_avx((undefined1  [16])aVar5,(undefined1  [16])paVar23[-2],1);
                  if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar28[0xf] < '\0') {
                    paVar23[-3] = paVar23[-2];
                    paVar23[-2] = aVar5;
                    auVar28 = vpermilps_avx(*(undefined1 (*) [16])(pNVar22 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar22 + -3) = auVar28;
                  }
                }
              }
              sVar13 = sVar14;
            } while (sVar14 != 8);
          }
          bVar8 = false;
        }
LAB_00332e75:
      } while (!bVar8);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }